

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void MoveBeforeTable(TidyDocImpl *doc,Node *row,Node *node)

{
  Dict *pDVar1;
  TidyDocImpl *element;
  
  element = doc;
  do {
    element = (TidyDocImpl *)(element->root).parent;
    if (element == (TidyDocImpl *)0x0) {
      prvTidyInsertNodeBeforeElement((doc->root).parent,row);
      return;
    }
    pDVar1 = (element->root).tag;
  } while ((pDVar1 == (Dict *)0x0) || (pDVar1->id != TidyTag_TABLE));
  prvTidyInsertNodeBeforeElement((Node *)element,row);
  return;
}

Assistant:

static void MoveBeforeTable( TidyDocImpl* ARG_UNUSED(doc), Node *row,
                             Node *node )
{
    Node *table;

    /* first find the table element */
    for (table = row->parent; table; table = table->parent)
    {
        if ( nodeIsTABLE(table) )
        {
            TY_(InsertNodeBeforeElement)( table, node );
            return;
        }
    }
    /* No table element */
    TY_(InsertNodeBeforeElement)( row->parent, node );
}